

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

CfgNode * node2name_abi_cxx11_(CfgNode *node)

{
  Type TVar1;
  ostream *poVar2;
  Addr AVar3;
  CfgNode *in_RSI;
  allocator local_1ba;
  allocator local_1b9;
  stringstream local_1b8 [8];
  stringstream ss;
  undefined1 local_1a8 [399];
  allocator local_19;
  CfgNode *local_18;
  CfgNode *node_local;
  
  node_local = node;
  if (in_RSI != (CfgNode *)0x0) {
    local_18 = in_RSI;
    TVar1 = CfgNode::type(in_RSI);
    switch(TVar1) {
    case CFG_ENTRY:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)node,"entry",&local_19);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      break;
    case CFG_BLOCK:
    case CFG_PHANTOM:
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar2 = (ostream *)std::ostream::operator<<(local_1a8,std::hex);
      poVar2 = std::operator<<(poVar2,"0x");
      AVar3 = CfgNode::node2addr(local_18);
      std::ostream::operator<<(poVar2,AVar3);
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      break;
    case CFG_EXIT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)node,"exit",&local_1b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      break;
    case CFG_HALT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)node,"halt",&local_1ba);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ba);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x1b9,"std::string node2name(CfgNode *)");
    }
    return node;
  }
  __assert_fail("node != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,0x1aa,"std::string node2name(CfgNode *)");
}

Assistant:

static
std::string node2name(CfgNode* node) {
	assert(node != 0);
	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			return "entry";
		case CfgNode::CFG_PHANTOM:
		case CfgNode::CFG_BLOCK: {
			std::stringstream ss;
			ss << std::hex << "0x" << CfgNode::node2addr(node);
			return ss.str();
			} break;
		case CfgNode::CFG_EXIT:
			return "exit";
		case CfgNode::CFG_HALT:
			return "halt";
		default:
			assert(false);
	}
	return "";
}